

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O1

bool __thiscall cppnet::Bitmap::Remove(Bitmap *this,uint32_t index)

{
  ulong *puVar1;
  pointer plVar2;
  byte bVar3;
  ulong uVar4;
  
  plVar2 = (this->_bitmap).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = ((long)(this->_bitmap).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)plVar2) * 8;
  if (index <= uVar4) {
    bVar3 = (byte)index & 0x3f;
    puVar1 = (ulong *)(plVar2 + (index >> 6));
    *puVar1 = *puVar1 & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
    if (*puVar1 == 0) {
      this->_vec_bitmap = this->_vec_bitmap & ~(uint)(1L << ((byte)(index >> 6) & 0x3f));
    }
  }
  return index <= uVar4;
}

Assistant:

bool Bitmap::Remove(uint32_t index) {
    if (index > _bitmap.size() * __step_size) {
        return false;
    }

    // get index in vector
    uint32_t bitmap_index = index / __step_size;
    // get index in uint64_t
    uint32_t bit_index = index % __step_size;

    _bitmap[bitmap_index] &= ~(__setp_base << bit_index);
    if (_bitmap[bitmap_index] == 0) {
        _vec_bitmap &= ~(__setp_base << bitmap_index);
    }
    return true;
}